

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

bool ImNodes::Connection(void *input_node,char *input_slot,void *output_node,char *output_slot)

{
  Pair **ppPVar1;
  undefined8 *puVar2;
  ImGuiStorage *this;
  Pair *pPVar3;
  _IgnoreSlot *p_Var4;
  float *pfVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ImU32 IVar9;
  int iVar10;
  void *__dest;
  int iVar11;
  int iVar12;
  _IgnoreSlot *this_00;
  char *__s2;
  float fVar13;
  float fVar14;
  int pending_slot_kind;
  char *pending_slot_title;
  void *pending_node_id;
  int local_7c;
  char *local_78;
  char *local_70;
  void *local_68;
  ImVec2 local_60;
  _IgnoreSlot local_58;
  ImVec2 local_38;
  
  pfVar5 = gCanvas;
  if (gCanvas == (float *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,600,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (input_node == (void *)0x0) {
    __assert_fail("input_node != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x259,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (input_slot == (char *)0x0) {
    __assert_fail("input_slot != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x25a,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
  }
  if (output_node != (void *)0x0) {
    if (output_slot == (char *)0x0) {
      __assert_fail("output_slot != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                    ,0x25c,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
    }
    this = *(ImGuiStorage **)(gCanvas + 0x26);
    pPVar3 = this[3].Data.Data;
    bVar8 = true;
    if (pPVar3 != (Pair *)output_node && pPVar3 != (Pair *)input_node) {
      IVar9 = MakeSlotDataID("x",input_slot,input_node,true);
      fVar13 = ImGuiStorage::GetFloat(this,IVar9,0.0);
      IVar9 = MakeSlotDataID("y",input_slot,input_node,true);
      local_60.y = ImGuiStorage::GetFloat(this,IVar9,0.0);
      IVar9 = MakeSlotDataID("x",output_slot,output_node,false);
      fVar14 = ImGuiStorage::GetFloat(this,IVar9,0.0);
      local_70 = output_slot;
      IVar9 = MakeSlotDataID("y",output_slot,output_node,false);
      local_38.y = ImGuiStorage::GetFloat(this,IVar9,0.0);
      local_60.x = fVar13 + pfVar5[0x24] * *pfVar5;
      local_38.x = fVar14 - pfVar5[0x24] * *pfVar5;
      bVar6 = RenderConnection(&local_60,&local_38,pfVar5[0x23]);
      bVar8 = true;
      if ((bVar6) && (bVar7 = ImGui::IsWindowHovered(0), bVar7)) {
        bVar8 = ImGui::IsMouseDoubleClicked(0);
        bVar8 = !bVar8;
      }
      IVar9 = MakeSlotDataID("hovered",input_slot,input_node,true);
      ImGuiStorage::SetFloat(this,IVar9,(float)(byte)(bVar6 & bVar8));
      __s2 = local_70;
      IVar9 = MakeSlotDataID("hovered",local_70,output_node,false);
      ImGuiStorage::SetFloat(this,IVar9,(float)(byte)(bVar6 & bVar8));
      bVar6 = GetPendingConnection(&local_68,&local_78,&local_7c);
      if (bVar6) {
        local_58.node_id = (void *)0x0;
        local_58.slot_name = (char *)0x0;
        local_58.slot_kind = 0;
        local_58._20_4_ = 0;
        if (local_7c < 0) {
          if (local_68 != input_node) {
            return bVar8;
          }
          iVar10 = strcmp(local_78,input_slot);
          if (iVar10 != 0) {
            return bVar8;
          }
          iVar10 = 1;
          input_node = output_node;
        }
        else {
          if (local_68 != output_node) {
            return bVar8;
          }
          iVar10 = strcmp(local_78,__s2);
          if (iVar10 != 0) {
            return bVar8;
          }
          iVar10 = -1;
          __s2 = input_slot;
        }
        local_58.slot_kind = iVar10;
        p_Var4 = *(_IgnoreSlot **)&this[10].Data;
        iVar10 = *(int *)&this[9].Data.Data;
        this_00 = p_Var4;
        local_58.node_id = input_node;
        local_58.slot_name = __s2;
        do {
          if (p_Var4 + iVar10 <= this_00) {
            iVar10 = *(int *)&this[9].Data.Data;
            if (iVar10 == *(int *)((long)&this[9].Data.Data + 4)) {
              if (iVar10 == 0) {
                iVar11 = 8;
              }
              else {
                iVar11 = iVar10 / 2 + iVar10;
              }
              iVar12 = iVar10 + 1;
              if (iVar10 + 1 < iVar11) {
                iVar12 = iVar11;
              }
              __dest = ImGui::MemAlloc((long)iVar12 * 0x18);
              if (*(void **)&this[10].Data != (void *)0x0) {
                memcpy(__dest,*(void **)&this[10].Data,(long)*(int *)&this[9].Data.Data * 0x18);
                ImGui::MemFree(*(void **)&this[10].Data);
              }
              *(void **)&this[10].Data = __dest;
              *(int *)((long)&this[9].Data.Data + 4) = iVar12;
              iVar10 = *(int *)&this[9].Data.Data;
            }
            else {
              __dest = *(void **)&this[10].Data;
            }
            *(undefined8 *)((long)__dest + (long)iVar10 * 0x18 + 0x10) = local_58._16_8_;
            puVar2 = (undefined8 *)((long)__dest + (long)iVar10 * 0x18);
            *puVar2 = local_58.node_id;
            puVar2[1] = local_58.slot_name;
            ppPVar1 = &this[9].Data.Data;
            *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
            return bVar8;
          }
          bVar6 = _IgnoreSlot::operator==(this_00,&local_58);
          this_00 = this_00 + 1;
        } while (!bVar6);
      }
    }
    return bVar8;
  }
  __assert_fail("output_node != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                ,0x25b,"bool ImNodes::Connection(void *, const char *, void *, const char *)");
}

Assistant:

bool Connection(void* input_node, const char* input_slot, void* output_node, const char* output_slot)
{
    assert(gCanvas != nullptr);
    assert(input_node != nullptr);
    assert(input_slot != nullptr);
    assert(output_node != nullptr);
    assert(output_slot != nullptr);

    bool is_connected = true;
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    if (input_node == impl->auto_position_node_id || output_node == impl->auto_position_node_id)
        // Do not render connection to newly added output node because node is rendered outside of screen on the first frame and will be repositioned.
        return is_connected;

    ImVec2 input_slot_pos{
        impl->cached_data.GetFloat(MakeSlotDataID("x", input_slot, input_node, true)),
        impl->cached_data.GetFloat(MakeSlotDataID("y", input_slot, input_node, true)),
    };

    ImVec2 output_slot_pos{
        impl->cached_data.GetFloat(MakeSlotDataID("x", output_slot, output_node, false)),
        impl->cached_data.GetFloat(MakeSlotDataID("y", output_slot, output_node, false)),
    };

    // Indent connection a bit into slot widget.
    float connection_indent = canvas->style.connection_indent * canvas->zoom;
    input_slot_pos.x += connection_indent;
    output_slot_pos.x -= connection_indent;

    bool curve_hovered = RenderConnection(input_slot_pos, output_slot_pos, canvas->style.curve_thickness);
    if (curve_hovered && ImGui::IsWindowHovered())
    {
        if (ImGui::IsMouseDoubleClicked(0))
            is_connected = false;
    }

    impl->cached_data.SetFloat(MakeSlotDataID("hovered", input_slot, input_node, true), curve_hovered && is_connected);
    impl->cached_data.SetFloat(MakeSlotDataID("hovered", output_slot, output_node, false), curve_hovered && is_connected);

    void* pending_node_id;
    const char* pending_slot_title;
    int pending_slot_kind;
    if (GetPendingConnection(&pending_node_id, &pending_slot_title, &pending_slot_kind))
    {
        _IgnoreSlot ignore_connection{};
        if (IsInputSlotKind(pending_slot_kind))
        {
            if (pending_node_id == input_node && strcmp(pending_slot_title, input_slot) == 0)
            {
                ignore_connection.node_id = output_node;
                ignore_connection.slot_name = output_slot;
                ignore_connection.slot_kind = OutputSlotKind(1);
            }
        }
        else
        {
            if (pending_node_id == output_node && strcmp(pending_slot_title, output_slot) == 0)
            {
                ignore_connection.node_id = input_node;
                ignore_connection.slot_name = input_slot;
                ignore_connection.slot_kind = InputSlotKind(1);
            }
        }
        if (ignore_connection.node_id)
        {
            if (!impl->ignore_connections.contains(ignore_connection))
                impl->ignore_connections.push_back(ignore_connection);
        }
    }

    return is_connected;
}